

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::MethodOptions::MergeFrom(MethodOptions *this,Message *from)

{
  MethodOptions *pMVar1;
  MethodOptions *in_RDI;
  MethodOptions *unaff_retaddr;
  MethodOptions *source;
  Message *in_stack_000003c8;
  Message *in_stack_000003d0;
  
  pMVar1 = DynamicCastToGenerated<google::protobuf::MethodOptions>(&in_RDI->super_Message);
  if (pMVar1 == (MethodOptions *)0x0) {
    internal::ReflectionOps::Merge(in_stack_000003d0,in_stack_000003c8);
  }
  else {
    MergeFrom(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void MethodOptions::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.MethodOptions)
  GOOGLE_DCHECK_NE(&from, this);
  const MethodOptions* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<MethodOptions>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.MethodOptions)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.MethodOptions)
    MergeFrom(*source);
  }
}